

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

void __thiscall
absl::
InlinedVector<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>_>
::Destroy(InlinedVector<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>_>
          *this,pointer from,pointer to)

{
  allocator_type *__a;
  difference_type dVar1;
  unsigned_long len;
  pointer cur;
  pointer to_local;
  pointer from_local;
  InlinedVector<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>_>
  *this_local;
  
  for (len = (unsigned_long)from; (pointer)len != to; len = len + 0x18) {
    __a = allocator(this);
    std::allocator_traits<std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>_>::
    destroy<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>(__a,(QueueEntry *)len);
  }
  if (from != to) {
    dVar1 = std::distance<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry*>(from,to);
    memset(from,0xab,dVar1 * 0x18);
  }
  return;
}

Assistant:

void InlinedVector<T, N, A>::Destroy(pointer from, pointer to) {
  for (pointer cur = from; cur != to; ++cur) {
    std::allocator_traits<allocator_type>::destroy(allocator(), cur);
  }
#ifndef NDEBUG
  // Overwrite unused memory with `0xab` so we can catch uninitialized usage.
  // Cast to `void*` to tell the compiler that we don't care that we might be
  // scribbling on a vtable pointer.
  if (from != to) {
    auto len = sizeof(value_type) * std::distance(from, to);
    std::memset(reinterpret_cast<void*>(from), 0xab, len);
  }
#endif
}